

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

Timer _fill_random<long,phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
                (vector<long,_std::allocator<long>_> *v,
                parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *hash)

{
  undefined1 auVar1 [16];
  time_point tVar2;
  long lVar3;
  long lVar4;
  ulong local_88 [2];
  _Head_base<0UL,_const_long_&&,_false> local_78;
  _Head_base<0UL,_long_&&,_false> local_70;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
  local_68;
  
  _fill<long>(v);
  _shuffle<long>(v);
  tVar2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  lVar4 = (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_start;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    lVar3 = 0;
    do {
      local_88[0] = (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar3];
      local_88[1] = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_88[0];
      local_70._M_head_impl = (long *)(local_88 + 1);
      local_78._M_head_impl = (long *)local_88;
      phmap::priv::
      parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<long,long>,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>>
      ::
      emplace_decomposable_with_hash<long,std::piecewise_construct_t_const&,std::tuple<long_const&&>,std::tuple<long&&>>
                (&local_68,
                 (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<long,long>,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>>
                  *)hash,(long *)local_88,
                 SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
                 (piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<const_long_&&> *)&local_78,(tuple<long_&&> *)&local_70);
      lVar3 = lVar3 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar3);
  }
  return (Timer)(rep)tVar2.__d.__r;
}

Assistant:

Timer _fill_random(vector<T> &v, HT &hash)
{
    _fill<T>(v);
    _shuffle<T>(v);
    
    Timer timer(true);

    for (size_t i = 0, sz = v.size(); i < sz; ++i)
        hash.insert(typename HT::value_type(v[i], 0));
    return timer;
}